

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O3

void __thiscall
CHog::initialHist(CHog *this,int _imgWidth,int _imgHeight,int _imgChannel,int _windowWidth,
                 int _windowHeight,int _numOriHalf,int _numOriFull,int _cellSize)

{
  size_t __n;
  undefined1 auVar1 [16];
  int iVar2;
  ulong uVar3;
  histCell **pphVar4;
  ulong uVar5;
  ulong uVar6;
  histCell *phVar7;
  void *pvVar8;
  int **ppiVar9;
  int *piVar10;
  ostream *poVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  size_t sVar19;
  
  if ((_windowWidth % _cellSize == 0) &&
     (iVar2 = _windowHeight / _cellSize, _windowHeight % _cellSize == 0)) {
    this->cellSize = _cellSize;
    this->windowHeight = _windowHeight;
    this->windowWidth = _windowWidth;
    this->numCellX = _windowWidth / _cellSize;
    this->numCellY = iVar2;
    uVar14 = _windowWidth / _cellSize + 2;
    uVar15 = (ulong)uVar14;
    this->histSizeX = uVar14;
    uVar3 = (ulong)(iVar2 + 2U);
    this->histSizeY = iVar2 + 2U;
    this->imgWidth = _imgWidth;
    this->imgHeight = _imgHeight;
    this->imgChannel = _imgChannel;
    this->widthStep = _imgChannel * _imgWidth;
    uVar13 = uVar3 * 8;
    if (iVar2 < -2) {
      uVar13 = 0xffffffffffffffff;
    }
    pphVar4 = (histCell **)operator_new__(uVar13);
    this->hist = pphVar4;
    if (-2 < iVar2) {
      uVar13 = (ulong)(uint)_numOriFull << 3;
      if (_numOriFull < 0) {
        uVar13 = 0xffffffffffffffff;
      }
      uVar5 = (ulong)(uint)_numOriHalf << 3;
      if (_numOriHalf < 0) {
        uVar5 = 0xffffffffffffffff;
      }
      uVar14 = _numOriHalf + _numOriFull + 4;
      uVar12 = (ulong)uVar14 * 8;
      if (_numOriFull + _numOriHalf < -4) {
        uVar12 = 0xffffffffffffffff;
      }
      lVar18 = 0;
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)(int)uVar15;
        uVar6 = SUB168(auVar1 * ZEXT816(0x30),0);
        if (SUB168(auVar1 * ZEXT816(0x30),8) != 0) {
          uVar6 = 0xffffffffffffffff;
        }
        phVar7 = (histCell *)operator_new__(uVar6);
        this->hist[lVar18] = phVar7;
        if (0 < (int)uVar15) {
          lVar17 = 0;
          lVar16 = 0;
          do {
            pvVar8 = operator_new__(uVar13);
            pphVar4 = this->hist;
            *(void **)((long)&pphVar4[lVar18]->cellBinsFull + lVar17) = pvVar8;
            pvVar8 = operator_new__(uVar5);
            *(void **)((long)&pphVar4[lVar18]->cellBinsHalf + lVar17) = pvVar8;
            *(uint *)((long)&pphVar4[lVar18]->dim + lVar17) = uVar14;
            pvVar8 = operator_new__(uVar12);
            *(void **)((long)&pphVar4[lVar18]->feat + lVar17) = pvVar8;
            phVar7 = pphVar4[lVar18];
            *(int *)((long)&phVar7->numOriFull + lVar17) = _numOriFull;
            *(int *)((long)&phVar7->numOriHalf + lVar17) = _numOriHalf;
            *(undefined8 *)((long)&phVar7->normFactorHalf + lVar17) = 0;
            memset(*(void **)((long)&phVar7->cellBinsFull + lVar17),0,(long)_numOriFull << 3);
            memset(*(void **)((long)&this->hist[lVar18]->cellBinsHalf + lVar17),0,
                   (long)*(int *)((long)&this->hist[lVar18]->numOriHalf + lVar17) << 3);
            memset(*(void **)((long)&this->hist[lVar18]->feat + lVar17),0,
                   (long)*(int *)((long)&this->hist[lVar18]->dim + lVar17) << 3);
            lVar16 = lVar16 + 1;
            uVar15 = (ulong)this->histSizeX;
            lVar17 = lVar17 + 0x30;
          } while (lVar16 < (long)uVar15);
          uVar3 = (ulong)(uint)this->histSizeY;
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 < (int)uVar3);
      _imgHeight = this->imgHeight;
    }
    uVar13 = (long)_imgHeight * 8;
    if (_imgHeight < 0) {
      uVar13 = 0xffffffffffffffff;
    }
    ppiVar9 = (int **)operator_new__(uVar13);
    this->dx = ppiVar9;
    ppiVar9 = (int **)operator_new__(uVar13);
    this->dy = ppiVar9;
    if (0 < _imgHeight) {
      lVar18 = 0;
      do {
        __n = (long)this->imgWidth * 4;
        sVar19 = __n;
        if ((long)this->imgWidth < 0) {
          sVar19 = 0xffffffffffffffff;
        }
        piVar10 = (int *)operator_new__(sVar19);
        this->dx[lVar18] = piVar10;
        piVar10 = (int *)operator_new__(sVar19);
        this->dy[lVar18] = piVar10;
        memset(this->dx[lVar18],0,__n);
        memset(this->dy[lVar18],0,(long)this->imgWidth << 2);
        lVar18 = lVar18 + 1;
      } while (lVar18 < this->imgHeight);
    }
    return;
  }
  poVar11 = std::operator<<((ostream *)&std::cout,"image size is not N*cellSize");
  std::endl<char,std::char_traits<char>>(poVar11);
  exit(0);
}

Assistant:

void CHog::initialHist(int _imgWidth,
                       int _imgHeight,
                       int _imgChannel,
                       int _windowWidth,
                       int _windowHeight,
                       int _numOriHalf, //方向量化个数
                       int _numOriFull,
                       int _cellSize) //cell尺寸
{
    //cout<<"hog hist intializing"<<endl;
    if(_windowWidth%_cellSize!=0 || _windowHeight%_cellSize!=0)  //判断图像尺寸是否是cell尺寸的整倍数
    {
        cout<<"image size is not N*cellSize"<<endl;
        exit(0);
    }
    cellSize = _cellSize;
    windowHeight = _windowHeight;
    windowWidth = _windowWidth;
    numCellX = _windowWidth/cellSize;
    numCellY = _windowHeight/cellSize;
    histSizeX = numCellX + 2;
    histSizeY = numCellY + 2;
    imgWidth = _imgWidth;
    imgHeight = _imgHeight;
    imgChannel = _imgChannel;
    widthStep = imgWidth*imgChannel;
    //为直方图分配空间，并赋初始值0//
    hist = new histCell*[histSizeY];
    for(int y=0; y<histSizeY; y++)
    {
        hist[y] = new histCell[histSizeX];
        for(int x=0; x<histSizeX; x++)
        {
            hist[y][x].cellBinsFull = new double[_numOriFull];  //为一个cell进行空间分配
            hist[y][x].cellBinsHalf = new double[_numOriHalf];
            hist[y][x].dim = 4 + (_numOriFull+_numOriHalf);
            hist[y][x].feat = new double[hist[y][x].dim];
            hist[y][x].numOriFull = _numOriFull;
            hist[y][x].numOriHalf = _numOriHalf;
            //hist[y][x].normFactorFull = 0.;
            hist[y][x].normFactorHalf = 0.;
            memset(hist[y][x].cellBinsFull, 0, hist[y][x].numOriFull*sizeof(double));  //将直方图初始化为全0
            memset(hist[y][x].cellBinsHalf, 0, hist[y][x].numOriHalf*sizeof(double));
            memset(hist[y][x].feat, 0, hist[y][x].dim*sizeof(double));
        }
    }
    //为微分图像分配空间,并赋初始值0//
    dx = new int*[imgHeight];
    dy = new int*[imgHeight];
    for(int y=0; y<imgHeight; y++)
    {
        dx[y] = new int[imgWidth];
        dy[y] = new int[imgWidth];
        memset(dx[y], 0, imgWidth*sizeof(int));
        memset(dy[y], 0, imgWidth*sizeof(int));
    }
    //cout<<"hog hist intialized"<<endl;
}